

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geom3d.c
# Opt level: O2

matrix4 * v3rotationMat(vector3d *axis,double theta,matrix4 *m)

{
  double dVar1;
  double dVar2;
  double dVar3;
  undefined1 auVar4 [16];
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  
  dVar1 = axis->z;
  dVar5 = axis->x;
  dVar6 = axis->y;
  dVar2 = cos(theta * 0.017453293);
  dVar3 = sin(theta * 0.017453293);
  m->element[0][3] = 0.0;
  dVar7 = 1.0 - dVar2;
  m->element[1][3] = 0.0;
  m->element[2][3] = 0.0;
  m->element[3][0] = 0.0;
  m->element[3][1] = 0.0;
  m->element[3][2] = 0.0;
  m->element[3][3] = 1.0;
  dVar8 = dVar5 * dVar7;
  dVar9 = dVar8 * dVar6 + dVar1 * dVar3;
  auVar4._8_4_ = SUB84(dVar9,0);
  auVar4._0_8_ = dVar8 * dVar5 + dVar2;
  auVar4._12_4_ = (int)((ulong)dVar9 >> 0x20);
  *(undefined1 (*) [16])m->element[0] = auVar4;
  m->element[0][2] = dVar8 * dVar1 - dVar6 * dVar3;
  dVar9 = dVar6 * dVar7;
  m->element[1][0] = dVar9 * dVar5 + -(dVar1 * dVar3);
  m->element[1][1] = dVar9 * dVar6 + dVar2;
  m->element[1][2] = dVar9 * dVar1 + dVar3 * dVar5;
  dVar7 = dVar7 * dVar1;
  m->element[2][0] = dVar7 * dVar5 + dVar6 * dVar3;
  m->element[2][1] = dVar7 * dVar6 + -(dVar3 * dVar5);
  m->element[2][2] = dVar7 * dVar1 + dVar2;
  return m;
}

Assistant:

matrix4*  v3rotationMat(vector3d* axis, double theta, matrix4* m) {
	double c, s, t, x, y, z;

	x = axis->x;
	y = axis->y;
	z = axis->z;

	c = cos(theta*DEG2RAD);
	s = sin(theta*DEG2RAD);
	t = 1.0 - c;

	v3identityMat(m);

	m->element[0][0] = t * x * x    +        c;
	m->element[0][1] = t * x * y    +    z * s;
	m->element[0][2] = t * x * z    -    y * s;

	m->element[1][0] = t * y * x    -    z * s;
	m->element[1][1] = t * y * y    +        c;
	m->element[1][2] = t * y * z    +    x * s;

	m->element[2][0] = t * z * x    +    y * s;
	m->element[2][1] = t * z * y    -    x * s;
	m->element[2][2] = t * z * z    +        c;

	return(m);
}